

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

pair<tinyusdz::Path,_tinyusdz::Path> * __thiscall
tinyusdz::Path::split_at_root
          (pair<tinyusdz::Path,_tinyusdz::Path> *__return_storage_ptr__,Path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Path rP;
  string p;
  string root;
  Path sP;
  string siblings;
  Path local_250;
  string local_180;
  string local_160;
  Path local_140;
  string local_70;
  string local_50;
  
  sVar4 = (this->_prim_part)._M_string_length;
  if ((sVar4 == 0) || (*(this->_prim_part)._M_dataplus._M_p != '/')) {
    local_250._prim_part._M_dataplus._M_p = (pointer)&local_250._prim_part.field_2;
    local_250._prim_part._M_string_length = 0;
    local_250._prim_part.field_2._M_local_buf[0] = '\0';
    local_250._prop_part._M_dataplus._M_p = (pointer)&local_250._prop_part.field_2;
    local_250._prop_part._M_string_length = 0;
    local_250._prop_part.field_2._M_local_buf[0] = '\0';
    paVar5 = &local_250._variant_part.field_2;
    local_250._variant_part._M_string_length = 0;
    local_250._variant_part.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_250._variant_selection_part.field_2;
    local_250._variant_selection_part._M_string_length = 0;
    local_250._variant_selection_part.field_2._M_local_buf[0] = '\0';
    paVar8 = &local_250._variant_part_str.field_2;
    local_250._variant_part_str._M_string_length = 0;
    local_250._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_250._element.field_2;
    local_250._element._M_string_length = 0;
    local_250._element.field_2._M_local_buf[0] = '\0';
    local_250._path_type.has_value_ = false;
    local_250._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_250._valid = false;
    local_250._variant_part._M_dataplus._M_p = (pointer)paVar5;
    local_250._variant_selection_part._M_dataplus._M_p = (pointer)paVar1;
    local_250._variant_part_str._M_dataplus._M_p = (pointer)paVar8;
    local_250._element._M_dataplus._M_p = (pointer)paVar2;
    Path(&__return_storage_ptr__->first,&local_250);
    Path(&__return_storage_ptr__->second,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._element._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._element._M_dataplus._M_p,
                      CONCAT71(local_250._element.field_2._M_allocated_capacity._1_7_,
                               local_250._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_part_str._M_dataplus._M_p != paVar8) {
      operator_delete(local_250._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_250._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_250._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_selection_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_250._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_250._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_part._M_dataplus._M_p != paVar5) {
      operator_delete(local_250._variant_part._M_dataplus._M_p,
                      CONCAT71(local_250._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_250._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._prop_part._M_dataplus._M_p != &local_250._prop_part.field_2) {
      operator_delete(local_250._prop_part._M_dataplus._M_p,
                      CONCAT71(local_250._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_250._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._prim_part._M_dataplus._M_p == &local_250._prim_part.field_2) {
      return __return_storage_ptr__;
    }
    local_180.field_2._M_allocated_capacity =
         CONCAT71(local_250._prim_part.field_2._M_allocated_capacity._1_7_,
                  local_250._prim_part.field_2._M_local_buf[0]);
    _Var7._M_p = local_250._prim_part._M_dataplus._M_p;
    goto LAB_00299ebe;
  }
  if ((sVar4 == 1) && (this->_valid != false)) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"/","");
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
    Path(&local_250,&local_180,&local_160);
    local_140._prim_part._M_dataplus._M_p = (pointer)&local_140._prim_part.field_2;
    local_140._prim_part._M_string_length = 0;
    local_140._prim_part.field_2._M_local_buf[0] = '\0';
    local_140._prop_part._M_dataplus._M_p = (pointer)&local_140._prop_part.field_2;
    local_140._prop_part._M_string_length = 0;
    local_140._prop_part.field_2._M_local_buf[0] = '\0';
    paVar5 = &local_140._variant_part.field_2;
    local_140._variant_part._M_string_length = 0;
    local_140._variant_part.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_140._variant_selection_part.field_2;
    local_140._variant_selection_part._M_string_length = 0;
    local_140._variant_selection_part.field_2._M_local_buf[0] = '\0';
    paVar8 = &local_140._variant_part_str.field_2;
    local_140._variant_part_str._M_string_length = 0;
    local_140._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_140._element.field_2;
    local_140._element._M_string_length = 0;
    local_140._element.field_2._M_local_buf[0] = '\0';
    local_140._path_type.has_value_ = false;
    local_140._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_140._valid = false;
    local_140._variant_part._M_dataplus._M_p = (pointer)paVar5;
    local_140._variant_selection_part._M_dataplus._M_p = (pointer)paVar1;
    local_140._variant_part_str._M_dataplus._M_p = (pointer)paVar8;
    local_140._element._M_dataplus._M_p = (pointer)paVar2;
    Path(&__return_storage_ptr__->first,&local_250);
    Path(&__return_storage_ptr__->second,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._element._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._element._M_dataplus._M_p,
                      CONCAT71(local_140._element.field_2._M_allocated_capacity._1_7_,
                               local_140._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._variant_part_str._M_dataplus._M_p != paVar8) {
      operator_delete(local_140._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_140._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_140._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._variant_selection_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_140._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_140._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._variant_part._M_dataplus._M_p != paVar5) {
      operator_delete(local_140._variant_part._M_dataplus._M_p,
                      CONCAT71(local_140._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_140._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._prop_part._M_dataplus._M_p != &local_140._prop_part.field_2) {
      operator_delete(local_140._prop_part._M_dataplus._M_p,
                      CONCAT71(local_140._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_140._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._prim_part._M_dataplus._M_p != &local_140._prim_part.field_2) {
      operator_delete(local_140._prim_part._M_dataplus._M_p,
                      CONCAT71(local_140._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_140._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._element._M_dataplus._M_p != &local_250._element.field_2) {
      operator_delete(local_250._element._M_dataplus._M_p,
                      CONCAT71(local_250._element.field_2._M_allocated_capacity._1_7_,
                               local_250._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_part_str._M_dataplus._M_p != &local_250._variant_part_str.field_2) {
      operator_delete(local_250._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_250._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_250._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_selection_part._M_dataplus._M_p !=
        &local_250._variant_selection_part.field_2) {
      operator_delete(local_250._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_250._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_250._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._variant_part._M_dataplus._M_p != &local_250._variant_part.field_2) {
      operator_delete(local_250._variant_part._M_dataplus._M_p,
                      CONCAT71(local_250._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_250._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._prop_part._M_dataplus._M_p != &local_250._prop_part.field_2) {
      operator_delete(local_250._prop_part._M_dataplus._M_p,
                      CONCAT71(local_250._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_250._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._prim_part._M_dataplus._M_p != &local_250._prim_part.field_2) {
      operator_delete(local_250._prim_part._M_dataplus._M_p,
                      CONCAT71(local_250._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_250._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    full_path_name_abi_cxx11_(&local_180,this);
    if (local_180._M_string_length < 2) {
LAB_00299d74:
      local_250._prim_part._M_dataplus._M_p = (pointer)&local_250._prim_part.field_2;
      local_250._prim_part._M_string_length = 0;
      local_250._prim_part.field_2._M_local_buf[0] = '\0';
      paVar5 = &local_250._prop_part.field_2;
      local_250._prop_part._M_string_length = 0;
      local_250._prop_part.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_250._variant_part.field_2;
      local_250._variant_part._M_string_length = 0;
      local_250._variant_part.field_2._M_local_buf[0] = '\0';
      paVar8 = &local_250._variant_selection_part.field_2;
      local_250._variant_selection_part._M_string_length = 0;
      local_250._variant_selection_part.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_250._variant_part_str.field_2;
      local_250._variant_part_str._M_string_length = 0;
      local_250._variant_part_str.field_2._M_local_buf[0] = '\0';
      paVar3 = &local_250._element.field_2;
      local_250._element._M_string_length = 0;
      local_250._element.field_2._M_local_buf[0] = '\0';
      local_250._path_type.has_value_ = false;
      local_250._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      local_250._valid = false;
      local_250._prop_part._M_dataplus._M_p = (pointer)paVar5;
      local_250._variant_part._M_dataplus._M_p = (pointer)paVar1;
      local_250._variant_selection_part._M_dataplus._M_p = (pointer)paVar8;
      local_250._variant_part_str._M_dataplus._M_p = (pointer)paVar2;
      local_250._element._M_dataplus._M_p = (pointer)paVar3;
      Path(&__return_storage_ptr__->first,this);
      Path(&__return_storage_ptr__->second,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._element._M_dataplus._M_p != paVar3) {
        operator_delete(local_250._element._M_dataplus._M_p,
                        CONCAT71(local_250._element.field_2._M_allocated_capacity._1_7_,
                                 local_250._element.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_part_str._M_dataplus._M_p != paVar2) {
        operator_delete(local_250._variant_part_str._M_dataplus._M_p,
                        CONCAT71(local_250._variant_part_str.field_2._M_allocated_capacity._1_7_,
                                 local_250._variant_part_str.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_selection_part._M_dataplus._M_p != paVar8) {
        operator_delete(local_250._variant_selection_part._M_dataplus._M_p,
                        CONCAT71(local_250._variant_selection_part.field_2._M_allocated_capacity.
                                 _1_7_,local_250._variant_selection_part.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_part._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._variant_part._M_dataplus._M_p,
                        CONCAT71(local_250._variant_part.field_2._M_allocated_capacity._1_7_,
                                 local_250._variant_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._prop_part._M_dataplus._M_p != paVar5) {
        operator_delete(local_250._prop_part._M_dataplus._M_p,
                        CONCAT71(local_250._prop_part.field_2._M_allocated_capacity._1_7_,
                                 local_250._prop_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._prim_part._M_dataplus._M_p == &local_250._prim_part.field_2)
      goto LAB_00299eb1;
      local_160.field_2._M_allocated_capacity =
           CONCAT71(local_250._prim_part.field_2._M_allocated_capacity._1_7_,
                    local_250._prim_part.field_2._M_local_buf[0]);
      _Var7._M_p = local_250._prim_part._M_dataplus._M_p;
    }
    else {
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_180._M_dataplus._M_p + 1);
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_180._M_dataplus._M_p + local_180._M_string_length);
      lVar6 = (long)(local_180._M_string_length - 1) >> 2;
      if (0 < lVar6) {
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar5->_M_local_buf + (local_180._M_string_length - 1 & 0xfffffffffffffffc));
        lVar6 = lVar6 + 1;
        _Var7._M_p = local_180._M_dataplus._M_p;
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(_Var7._M_p + 4);
          if (_Var7._M_p[1] == '/') {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(_Var7._M_p + 1);
            goto LAB_00299a9f;
          }
          if (_Var7._M_p[2] == '/') {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(_Var7._M_p + 2);
            goto LAB_00299a9f;
          }
          if (_Var7._M_p[3] == '/') {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(_Var7._M_p + 3);
            goto LAB_00299a9f;
          }
          if (paVar8->_M_local_buf[0] == '/') goto LAB_00299a9f;
          lVar6 = lVar6 + -1;
          _Var7._M_p = (pointer)paVar8;
        } while (1 < lVar6);
      }
      lVar6 = (long)paVar1 - (long)paVar5->_M_local_buf;
      if (lVar6 == 1) {
LAB_00299a84:
        paVar8 = paVar5;
        if (paVar5->_M_local_buf[0] != '/') {
          paVar8 = paVar1;
        }
      }
      else if (lVar6 == 2) {
LAB_00299a7c:
        paVar8 = paVar5;
        if (paVar5->_M_local_buf[0] != '/') {
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar5->_M_local_buf + 1);
          goto LAB_00299a84;
        }
      }
      else {
        if (lVar6 != 3) goto LAB_00299d74;
        paVar8 = paVar5;
        if (paVar5->_M_local_buf[0] != '/') {
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar5->_M_local_buf + 1);
          goto LAB_00299a7c;
        }
      }
LAB_00299a9f:
      if ((paVar8 == paVar1) ||
         (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p ||
          (long)paVar8 - (long)local_180._M_dataplus._M_p < 0)) goto LAB_00299d74;
      ::std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_180);
      ::std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_180);
      paVar5 = &local_140._prim_part.field_2;
      local_140._prim_part._M_dataplus._M_p = (pointer)paVar5;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      Path(&local_250,&local_160,&local_140._prim_part);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._prim_part._M_dataplus._M_p != paVar5) {
        operator_delete(local_140._prim_part._M_dataplus._M_p,
                        CONCAT71(local_140._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_140._prim_part.field_2._M_local_buf[0]) + 1);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      Path(&local_140,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Path(&__return_storage_ptr__->first,&local_250);
      Path(&__return_storage_ptr__->second,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._element._M_dataplus._M_p != &local_140._element.field_2) {
        operator_delete(local_140._element._M_dataplus._M_p,
                        CONCAT71(local_140._element.field_2._M_allocated_capacity._1_7_,
                                 local_140._element.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._variant_part_str._M_dataplus._M_p != &local_140._variant_part_str.field_2) {
        operator_delete(local_140._variant_part_str._M_dataplus._M_p,
                        CONCAT71(local_140._variant_part_str.field_2._M_allocated_capacity._1_7_,
                                 local_140._variant_part_str.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._variant_selection_part._M_dataplus._M_p !=
          &local_140._variant_selection_part.field_2) {
        operator_delete(local_140._variant_selection_part._M_dataplus._M_p,
                        CONCAT71(local_140._variant_selection_part.field_2._M_allocated_capacity.
                                 _1_7_,local_140._variant_selection_part.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._variant_part._M_dataplus._M_p != &local_140._variant_part.field_2) {
        operator_delete(local_140._variant_part._M_dataplus._M_p,
                        CONCAT71(local_140._variant_part.field_2._M_allocated_capacity._1_7_,
                                 local_140._variant_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._prop_part._M_dataplus._M_p != &local_140._prop_part.field_2) {
        operator_delete(local_140._prop_part._M_dataplus._M_p,
                        CONCAT71(local_140._prop_part.field_2._M_allocated_capacity._1_7_,
                                 local_140._prop_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._prim_part._M_dataplus._M_p != paVar5) {
        operator_delete(local_140._prim_part._M_dataplus._M_p,
                        CONCAT71(local_140._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_140._prim_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._element._M_dataplus._M_p != &local_250._element.field_2) {
        operator_delete(local_250._element._M_dataplus._M_p,
                        CONCAT71(local_250._element.field_2._M_allocated_capacity._1_7_,
                                 local_250._element.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_part_str._M_dataplus._M_p != &local_250._variant_part_str.field_2) {
        operator_delete(local_250._variant_part_str._M_dataplus._M_p,
                        CONCAT71(local_250._variant_part_str.field_2._M_allocated_capacity._1_7_,
                                 local_250._variant_part_str.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_selection_part._M_dataplus._M_p !=
          &local_250._variant_selection_part.field_2) {
        operator_delete(local_250._variant_selection_part._M_dataplus._M_p,
                        CONCAT71(local_250._variant_selection_part.field_2._M_allocated_capacity.
                                 _1_7_,local_250._variant_selection_part.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._variant_part._M_dataplus._M_p != &local_250._variant_part.field_2) {
        operator_delete(local_250._variant_part._M_dataplus._M_p,
                        CONCAT71(local_250._variant_part.field_2._M_allocated_capacity._1_7_,
                                 local_250._variant_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._prop_part._M_dataplus._M_p != &local_250._prop_part.field_2) {
        operator_delete(local_250._prop_part._M_dataplus._M_p,
                        CONCAT71(local_250._prop_part.field_2._M_allocated_capacity._1_7_,
                                 local_250._prop_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._prim_part._M_dataplus._M_p != &local_250._prim_part.field_2) {
        operator_delete(local_250._prim_part._M_dataplus._M_p,
                        CONCAT71(local_250._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_250._prim_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      _Var7._M_p = local_160._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_00299eb1;
    }
    operator_delete(_Var7._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
LAB_00299eb1:
  _Var7._M_p = local_180._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    return __return_storage_ptr__;
  }
LAB_00299ebe:
  operator_delete(_Var7._M_p,local_180.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Path, Path> Path::split_at_root() const {
  if (is_absolute_path()) {
    if (is_root_path()) {
      return std::make_pair(Path("/", ""), Path());
    }

    std::string p = full_path_name();

    if (p.size() < 2) {
      // Never should reach here. just in case
      return std::make_pair(*this, Path());
    }

    // Fine 2nd '/'
    auto ret =
        std::find_if(p.begin() + 1, p.end(), [](char c) { return c == '/'; });

    if (ret != p.end()) {
      auto ndist = std::distance(p.begin(), ret);  // distance from str[0]
      if (ndist < 1) {
        // This should not happen though.
        return std::make_pair(*this, Path());
      }
      size_t n = size_t(ndist);
      std::string root = p.substr(0, n);
      std::string siblings = p.substr(n);

      Path rP(root, "");
      Path sP(siblings, "");

      return std::make_pair(rP, sP);
    }

    return std::make_pair(*this, Path());
  } else {
    return std::make_pair(Path(), *this);
  }
}